

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountDifference.cpp
# Opt level: O0

void __thiscall OpenMD::CountDifference::writeSequence(CountDifference *this)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  string *psVar4;
  ostream *poVar5;
  ulong uVar6;
  size_type sVar7;
  reference pvVar8;
  undefined8 uVar9;
  SequentialAnalyzer *in_RDI;
  uint i;
  Revision r;
  ofstream ofs;
  Revision *in_stack_fffffffffffffd28;
  uint local_25c;
  string local_258 [32];
  string local_238 [48];
  ostream local_208 [520];
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_208,pcVar2,_S_bin);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    uVar9 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"CountDifference::writeSequence Error: failed to open %s\n",uVar9)
    ;
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar3 = std::operator<<(local_208,"# ");
    psVar4 = SequentialAnalyzer::getSequenceType_abi_cxx11_(in_RDI);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    std::operator<<(poVar3,"\n");
    poVar5 = std::operator<<(local_208,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_((Revision *)poVar3);
    poVar3 = std::operator<<(poVar5,local_238);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_238);
    poVar3 = std::operator<<(local_208,"# ");
    Revision::getBuildDate_abi_cxx11_(in_stack_fffffffffffffd28);
    poVar3 = std::operator<<(poVar3,local_258);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_258);
    poVar3 = std::operator<<(local_208,"# selection script1: \"");
    std::operator<<(poVar3,(string *)&in_RDI->selectionScript1_);
    poVar3 = std::operator<<(local_208,"\"\tselection script2: \"");
    poVar3 = std::operator<<(poVar3,(string *)&in_RDI->selectionScript2_);
    std::operator<<(poVar3,"\"\n");
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      poVar3 = std::operator<<(local_208,"# parameters: ");
      poVar3 = std::operator<<(poVar3,(string *)&in_RDI->paramString_);
      std::operator<<(poVar3,"\n");
    }
    std::operator<<(local_208,"#time\tvalue\n");
    local_25c = 0;
    while( true ) {
      uVar6 = (ulong)local_25c;
      sVar7 = std::vector<double,_std::allocator<double>_>::size(&in_RDI->times_);
      if (sVar7 <= uVar6) break;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->times_,(ulong)local_25c);
      poVar3 = (ostream *)std::ostream::operator<<(local_208,*pvVar8);
      poVar3 = std::operator<<(poVar3,"\t");
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 1),(ulong)local_25c);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar8);
      std::operator<<(poVar3,"\n");
      local_25c = local_25c + 1;
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void CountDifference::writeSequence() {
    std::ofstream ofs(outputFilename_.c_str(), std::ios::binary);

    if (ofs.is_open()) {
      Revision r;

      ofs << "# " << getSequenceType() << "\n";
      ofs << "# OpenMD " << r.getFullRevision() << "\n";
      ofs << "# " << r.getBuildDate() << "\n";
      ofs << "# selection script1: \"" << selectionScript1_;
      ofs << "\"\tselection script2: \"" << selectionScript2_ << "\"\n";
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";

      ofs << "#time\tvalue\n";

      for (unsigned int i = 0; i < times_.size(); ++i) {
        ofs << times_[i] << "\t" << values_[i] << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "CountDifference::writeSequence Error: failed to open %s\n",
               outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    ofs.close();
  }